

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScParser.cpp
# Opt level: O0

bool __thiscall ScParser::parseFunctionDecl(ScParser *this,char **data)

{
  bool bVar1;
  char **data_local;
  ScParser *this_local;
  
  this->m_hasCurrentState = false;
  bVar1 = expectStartsWith<20ul>(data,(char (*) [20])0x14a2ec);
  if (bVar1) {
    expectStartsWith<44ul>(data,(char (*) [44])"detail::reaction_result boost::statechart::");
    bVar1 = expectStartsWith<15ul>(data,(char (*) [15])"state_machine<");
    if (bVar1) {
      parseStateMachine(this,data);
      this_local._7_1_ = true;
    }
    else {
      bVar1 = expectStartsWith<14ul>(data,(char (*) [14])0x14a37f);
      if (bVar1) {
        parseSimpleState(this,data);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = parseReactMethod(this,data);
  }
  return this_local._7_1_;
}

Assistant:

bool ScParser::parseFunctionDecl(char *&data)
{
    m_hasCurrentState = false;

    // boost::statechart::detail::reaction_result
    //     boost::statechart::simple_state< *state-spec* >::
    //         local_react<boost::mpl::list<
    //                         boost::statechart::custom_reaction< *event-name* >,
    //                         boost::statechart::deferral< * event-name * >,
    //                         mpl_::na, ..., mpl_::na> >(
    //                            boost::statechart::event_base const&, void const*)>

    if (expectStartsWith(data, "boost::statechart::")) {
        expectStartsWith(data, "detail::reaction_result boost::statechart::");
        // boost::statechart::state_machine<fsm::StateMachine, fsm::NotStarted, ...
        if (expectStartsWith(data, "state_machine<")) {
            parseStateMachine(data);
            return true;
        }
        // boost::statechart::simple_state<fsm::NotStarted, fsm::StateMachine, ...
        if (expectStartsWith(data, "simple_state<")) {
            parseSimpleState(data);
            return true;
        }
        return false;
    }
    return parseReactMethod(data);
}